

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O3

void __thiscall
OpenMesh::ArrayKernel::resize(ArrayKernel *this,size_t _n_vertices,size_t _n_edges,size_t _n_faces)

{
  pointer ppBVar1;
  BaseProperty *pBVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer ppBVar4;
  
  std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::resize
            (&this->vertices_,_n_vertices);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::resize
            (&this->edges_,_n_edges);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::resize
            (&this->faces_,_n_faces);
  iVar3 = (*(this->super_BaseKernel)._vptr_BaseKernel[2])(this);
  ppBVar1 = (this->super_BaseKernel).vprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar4 = (this->super_BaseKernel).vprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar1;
      ppBVar4 = ppBVar4 + 1) {
    pBVar2 = *ppBVar4;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var,iVar3));
    }
  }
  iVar3 = (*(this->super_BaseKernel)._vptr_BaseKernel[3])(this);
  ppBVar1 = (this->super_BaseKernel).hprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar4 = (this->super_BaseKernel).hprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar1;
      ppBVar4 = ppBVar4 + 1) {
    pBVar2 = *ppBVar4;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var_00,iVar3));
    }
  }
  iVar3 = (*(this->super_BaseKernel)._vptr_BaseKernel[4])(this);
  ppBVar1 = (this->super_BaseKernel).eprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar4 = (this->super_BaseKernel).eprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar1;
      ppBVar4 = ppBVar4 + 1) {
    pBVar2 = *ppBVar4;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var_01,iVar3));
    }
  }
  iVar3 = (*(this->super_BaseKernel)._vptr_BaseKernel[5])(this);
  ppBVar1 = (this->super_BaseKernel).fprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar4 = (this->super_BaseKernel).fprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar1;
      ppBVar4 = ppBVar4 + 1) {
    pBVar2 = *ppBVar4;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var_02,iVar3));
    }
  }
  return;
}

Assistant:

void ArrayKernel::resize( size_t _n_vertices, size_t _n_edges, size_t _n_faces )
{
  vertices_.resize(_n_vertices);
  edges_.resize(_n_edges);
  faces_.resize(_n_faces);

  vprops_resize(n_vertices());
  hprops_resize(n_halfedges());
  eprops_resize(n_edges());
  fprops_resize(n_faces());
}